

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::UnsafeArenaSwap
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 aVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 aVar2;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar3;
  
  if (this == other) {
    return;
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    aVar1.arena = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    paVar3 = &heap_rep(this)->field_0;
    aVar1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar3->arena;
  }
  if ((undefined1  [16])((undefined1  [16])(other->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    aVar2.arena = internal::SooRep::soo_arena(&other->soo_rep_);
  }
  else {
    paVar3 = &heap_rep(other)->field_0;
    aVar2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar3->arena;
  }
  if (aVar1.arena == aVar2.arena) {
    InternalSwap(this,other);
    return;
  }
  UnsafeArenaSwap();
}

Assistant:

void RepeatedField<Element>::UnsafeArenaSwap(RepeatedField* other) {
  if (this == other) return;
  ABSL_DCHECK_EQ(GetArena(), other->GetArena());
  InternalSwap(other);
}